

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O1

Atom_p indigox::CreateAtom(void)

{
  Atom *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Atom_p AVar1;
  
  this = (Atom *)operator_new(0x90);
  Atom::Atom(this);
  (in_RDI->super_CountableObject<indigox::Atom>).id_ = (uid_t)this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<indigox::Atom*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &in_RDI->super_enable_shared_from_this<indigox::Atom>,this);
  std::__shared_ptr<indigox::Atom,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<indigox::Atom,indigox::Atom>
            ((__shared_ptr<indigox::Atom,(__gnu_cxx::_Lock_policy)2> *)in_RDI,this);
  AVar1.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  AVar1.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Atom_p)AVar1.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Atom_p CreateAtom() { return Atom_p(new Atom()); }